

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_extraction.hpp
# Opt level: O2

Image4u * eos::render::extract_texture
                    (Image4u *__return_storage_ptr__,Mesh *mesh,Matrix4f *view_model_matrix,
                    Matrix4f *projection_matrix,ProjectionType projection_type,Image4u *image,
                    int texturemap_resolution)

{
  undefined4 uVar1;
  undefined4 uVar4;
  DenseStorage<float,_2,_2,_1,_0> DVar2;
  undefined8 uVar3;
  pointer paVar5;
  pointer paVar6;
  pointer pMVar7;
  pointer paVar8;
  pointer pMVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint __line;
  const_reference cVar12;
  int iVar13;
  Matrix<float,_3,_1,_0,_3,_1> *vtx;
  pointer pMVar14;
  pointer paVar15;
  long lVar16;
  char *__assertion;
  ulong uVar17;
  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  *__range2;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  wnd_coords;
  vector<bool,_std::allocator<bool>_> per_vertex_visibility;
  Vector2f screen_coords;
  Texture image_to_extract_from_as_tex;
  Vector4f clip_coords;
  Rasterizer<eos::render::ExtractionFragmentShader> extraction_rasterizer;
  Vertex<double> local_a8;
  _Optional_payload_base<eos::render::Texture> local_58;
  
  paVar5 = (mesh->tti).
           super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar6 = (mesh->tti).
           super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar5 == paVar6 &&
      ((long)(mesh->vertices).
             super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mesh->vertices).
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start) / 0xc !=
      (long)(mesh->texcoords).
            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mesh->texcoords).
            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3) {
    __assertion = "mesh.vertices.size() == mesh.texcoords.size() || !mesh.tti.empty()";
    __line = 0x4d;
  }
  else {
    if ((paVar5 == paVar6) ||
       ((long)paVar6 - (long)paVar5 ==
        (long)(mesh->tvi).
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(mesh->tvi).
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start)) {
      Rasterizer<eos::render::ExtractionFragmentShader>::Rasterizer
                (&extraction_rasterizer,texturemap_resolution,texturemap_resolution);
      create_mipmapped_texture(&image_to_extract_from_as_tex,image,1);
      extraction_rasterizer.enable_depth_test = false;
      extraction_rasterizer.perspective_correct_barycentric_weights = false;
      compute_per_vertex_self_occlusion
                (&per_vertex_visibility,&mesh->vertices,&mesh->tvi,view_model_matrix,
                 (uint)(projection_type != Orthographic));
      wnd_coords.
      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      wnd_coords.
      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      wnd_coords.
      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pMVar7 = (mesh->vertices).
               super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pMVar14 = (mesh->vertices).
                     super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pMVar14 != pMVar7;
          pMVar14 = pMVar14 + 1) {
        screen_coords.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
        array = (PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>)
                (PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>)projection_matrix;
        Eigen::PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>>::
        PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,0>>
                  ((PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>> *)&clip_coords,
                   (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_0>_>
                    *)&screen_coords);
        detail::divide_by_w<float>((detail *)&screen_coords,(Vector4<float> *)&clip_coords);
        clip_coords.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
        array._0_8_ = screen_coords.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                      m_storage.m_data.array;
        uVar3 = clip_coords.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                m_data.array._0_8_;
        clip_coords.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
        array[0] = screen_coords.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                   m_storage.m_data.array[0];
        fVar18 = clip_coords.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                 m_data.array[0];
        clip_coords.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
        array[1] = screen_coords.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                   m_storage.m_data.array[1];
        fVar21 = clip_coords.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                 m_data.array[1];
        clip_coords.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
        array._0_8_ = uVar3;
        clip_coords.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
        array._8_8_ = view_model_matrix;
        clip_to_screen_space<float>
                  ((render *)&screen_coords,fVar18,fVar21,image->width_,image->height_);
        clip_coords.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
        array._0_8_ = screen_coords.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                      m_storage.m_data.array;
        std::
        vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
        ::push_back(&wnd_coords,(value_type *)&clip_coords);
      }
      fVar18 = (float)texturemap_resolution;
      paVar5 = (mesh->tti).
               super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      paVar6 = (mesh->tti).
               super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar16 = 8;
      uVar17 = 0;
      while( true ) {
        paVar8 = (mesh->tvi).
                 super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(mesh->tvi).
                           super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)paVar8) / 0xc) <=
            uVar17) break;
        paVar15 = paVar8;
        if (paVar5 != paVar6) {
          paVar15 = (mesh->tti).
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        cVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&per_vertex_visibility,
                            (long)*(int *)((long)paVar8->_M_elems + lVar16 + -8));
        if (cVar12) {
          cVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&per_vertex_visibility,
                              (long)*(int *)((long)paVar8->_M_elems + lVar16 + -4));
          if (cVar12) {
            cVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&per_vertex_visibility,
                                (long)*(int *)((long)paVar8->_M_elems + lVar16));
            if (cVar12) {
              pMVar9 = (mesh->texcoords).
                       super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              screen_coords.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
              m_data.array = (PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>)
                             (double)(SUB84((float  [2])
                                            pMVar9[*(int *)((long)paVar15->_M_elems + lVar16 + -8)].
                                            super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>
                                            .m_storage.m_data,0) * fVar18);
              auVar26._8_8_ = 0;
              auVar26._0_8_ =
                   *(ulong *)wnd_coords.
                             super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start
                             [*(int *)((long)paVar8->_M_elems + lVar16 + -8)].
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array;
              uVar1 = image->height_;
              uVar4 = image->width_;
              fVar21 = (float)(int)uVar1;
              fVar22 = (float)(int)uVar4;
              auVar19._4_4_ = fVar21;
              auVar19._0_4_ = fVar22;
              auVar19._8_8_ = 0;
              auVar19 = divps(auVar26,auVar19);
              DVar2.m_data.array =
                   pMVar9[*(int *)((long)paVar15->_M_elems + lVar16 + -4)].
                   super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data;
              clip_coords.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
              m_data.array._0_8_ = (BADTYPE)(DVar2.m_data.array[0] * fVar18);
              clip_coords.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
              m_data.array._8_8_ = (BADTYPE)(DVar2.m_data.array[1] * fVar18);
              auVar25._8_8_ = 0;
              auVar25._0_8_ =
                   *(ulong *)wnd_coords.
                             super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start
                             [*(int *)((long)paVar8->_M_elems + lVar16 + -4)].
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array;
              auVar24._4_4_ = fVar21;
              auVar24._0_4_ = fVar22;
              auVar24._8_8_ = 0;
              auVar26 = divps(auVar25,auVar24);
              iVar13 = *(int *)((long)paVar8->_M_elems + lVar16);
              DVar2.m_data.array =
                   pMVar9[*(int *)((long)paVar15->_M_elems + lVar16)].
                   super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data;
              local_a8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0] = (double)(DVar2.m_data.array[0] * fVar18);
              local_a8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[1] = (double)(DVar2.m_data.array[1] * fVar18);
              uVar3 = *(undefined8 *)
                       (wnd_coords.
                        super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar13].
                        super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
                        .array + 2);
              local_a8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[2] = (double)(float)uVar3;
              local_a8.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[3] = (double)(float)((ulong)uVar3 >> 0x20);
              auVar23._8_8_ = 0;
              auVar23._0_8_ =
                   *(ulong *)wnd_coords.
                             super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar13].
                             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array;
              auVar10._4_4_ = fVar21;
              auVar10._0_4_ = fVar22;
              auVar10._8_8_ = 0;
              auVar24 = divps(auVar23,auVar10);
              fVar21 = auVar24._0_4_;
              fVar22 = auVar24._4_4_;
              local_a8.texcoords.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
              m_storage.m_data.array[1]._0_4_ = SUB84((double)fVar22,0);
              local_a8.texcoords.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
              m_storage.m_data.array[0] = (double)fVar21;
              local_a8.texcoords.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
              m_storage.m_data.array[1]._4_4_ = (int)((ulong)(double)fVar22 >> 0x20);
              auVar20._4_4_ = -(uint)(auVar19._4_4_ < 0.0);
              auVar20._0_4_ = -(uint)(auVar19._0_4_ < 0.0);
              auVar20._8_4_ = -(uint)(auVar26._0_4_ < 0.0);
              auVar20._12_4_ = -(uint)(auVar26._4_4_ < 0.0);
              auVar11._4_4_ = -(uint)(1.0 < auVar19._4_4_);
              auVar11._0_4_ = -(uint)(1.0 < auVar19._0_4_);
              auVar11._8_4_ = -(uint)(1.0 < auVar26._0_4_);
              auVar11._12_4_ = -(uint)(1.0 < auVar26._4_4_);
              iVar13 = movmskps((int)wnd_coords.
                                     super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,auVar20 | auVar11);
              if ((((iVar13 == 0) && (fVar21 <= 1.0)) && (fVar22 <= 1.0)) &&
                 ((0.0 <= fVar21 && (0.0 <= fVar22)))) {
                std::_Optional_payload_base<eos::render::Texture>::
                _Optional_payload_base<eos::render::Texture&>
                          (&local_58,&image_to_extract_from_as_tex);
                Rasterizer<eos::render::ExtractionFragmentShader>::raster_triangle<double>
                          (&extraction_rasterizer,(Vertex<double> *)&screen_coords,
                           (Vertex<double> *)&clip_coords,&local_a8,
                           (optional<eos::render::Texture> *)&local_58);
                std::_Optional_payload_base<eos::render::Texture>::_M_reset(&local_58);
              }
            }
          }
        }
        uVar17 = uVar17 + 1;
        lVar16 = lVar16 + 0xc;
      }
      core::Image<eos::core::Pixel<unsigned_char,_4>_>::Image
                (__return_storage_ptr__,&extraction_rasterizer.colorbuffer);
      std::
      _Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
      ::~_Vector_base(&wnd_coords.
                       super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                     );
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&per_vertex_visibility.super__Bvector_base<std::allocator<bool>_>);
      std::
      vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
      ::~vector(&image_to_extract_from_as_tex.mipmaps);
      Rasterizer<eos::render::ExtractionFragmentShader>::~Rasterizer(&extraction_rasterizer);
      return __return_storage_ptr__;
    }
    __assertion = "mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size()";
    __line = 0x4f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/texture_extraction.hpp"
                ,__line,
                "eos::core::Image4u eos::render::extract_texture(const core::Mesh &, Eigen::Matrix4f, Eigen::Matrix4f, ProjectionType, const eos::core::Image4u &, int)"
               );
}

Assistant:

inline eos::core::Image4u extract_texture(const core::Mesh& mesh, Eigen::Matrix4f view_model_matrix,
                                          Eigen::Matrix4f projection_matrix, ProjectionType projection_type,
                                          const eos::core::Image4u& image, int texturemap_resolution = 512)
{
    // Assert that either there are texture coordinates given for each vertex (in which case the texture map
    // doesn't contain any seams), or that a separate list of texture triangle indices is given (i.e. mesh.tti
    // is not empty):
    assert(mesh.vertices.size() == mesh.texcoords.size() || !mesh.tti.empty());
    // Sanity check on the texture triangle indices: They should be either empty or equal to tvi.size():
    assert(mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size());

    using detail::divide_by_w;
    using detail::RayDirection;
    using Eigen::Vector2f;
    using Eigen::Vector2d;
    using Eigen::Vector3f;
    using Eigen::Vector3d;
    using Eigen::Vector4f;
    using Eigen::Vector4d;
    using std::vector;
    // We only need a rasteriser to remap the texture, not the complete SoftwareRenderer:
    Rasterizer<ExtractionFragmentShader> extraction_rasterizer(texturemap_resolution, texturemap_resolution);
    Texture image_to_extract_from_as_tex = create_mipmapped_texture(image, 1);
    extraction_rasterizer.enable_depth_test = false; // We don't need to depth-test in the rendered image (which is the texture map).
    extraction_rasterizer.perspective_correct_barycentric_weights = false; // We want the uncorrected lambda be passed to our shader

    // For the per-vertex view angle, and the self-occlusion tests, we have to know the projection type, and
    // then use different vector directions depending on the projection type:
    RayDirection ray_direction_type;
    if (projection_type == ProjectionType::Orthographic)
    {
        ray_direction_type = RayDirection::Parallel;
    } else
    {
        ray_direction_type = RayDirection::TowardsOrigin;
    }

    // Test for self-occlusion, i.e. whether each vertex is visible from
    // the camera origin:
    const vector<bool> per_vertex_visibility = compute_per_vertex_self_occlusion(
        mesh.vertices, mesh.tvi, view_model_matrix, ray_direction_type);

    vector<Vector4f> wnd_coords; // will contain [x_wnd, y_wnd, z_ndc, 1/w_clip]
    for (auto&& vtx : mesh.vertices)
    {
        Vector4f clip_coords = projection_matrix * view_model_matrix * vtx.homogeneous();
        clip_coords = divide_by_w(clip_coords);
        // Note: We could make use of a new `viewport` parameter here, to allow any viewport transformations.
        const Vector2f screen_coords =
            clip_to_screen_space(clip_coords.x(), clip_coords.y(), image.width(), image.height());
        clip_coords.x() = screen_coords.x(); // Todo: Can simplify this...?
        clip_coords.y() = screen_coords.y();
        wnd_coords.push_back(clip_coords);
    }

    // Go on with extracting: This only needs the rasteriser/FS, not the whole Renderer.
    const int tex_width = texturemap_resolution;
    const int tex_height =
        texturemap_resolution; // keeping this in case we need non-square texture maps at some point

    // Use Mesh::tti as texture triangle indices if present, tvi otherwise:
    const auto& mesh_tti = mesh.tti.empty() ? mesh.tvi : mesh.tti;

    for (std::size_t triangle_index = 0; triangle_index < mesh.tvi.size(); ++triangle_index)
    {
        // Select the three indices for the current triangle:
        const auto& tvi = mesh.tvi[triangle_index];
        const auto& tti = mesh_tti[triangle_index];

        // Check if all three vertices of the current triangle are visible, and use the triangle if so:
        if (per_vertex_visibility[tvi[0]] && per_vertex_visibility[tvi[1]] &&
            per_vertex_visibility[tvi[2]]) // can also try using ||, but...
        {
            // The model's texcoords become the locations to extract to in the framebuffer (which is the
            // texture map we're extracting to). The wnd_coords are the coordinates we're extracting from (the
            // original image), which from the perspective of the rasteriser, is the texture map, and thus
            // from the rasteriser's perspective they're the texture coords.
            //
            // (Note: A test with a rendered & re-extracted texture showed that we're off by a pixel or more,
            //  definitely need to correct this. Probably here. It looks like it is 1-2 pixels off. Definitely
            //  a bit more than 1.)
            detail::Vertex<double> pa{
                Vector4d(mesh.texcoords[tti[0]][0] * tex_width,
					 mesh.texcoords[tti[0]][1] * tex_height,
                     wnd_coords[tvi[0]].z(), // z_ndc
                     wnd_coords[tvi[0]].w()), // 1/w_clip
                Vector3d(),                       // empty
                Vector2d(wnd_coords[tvi[0]].x() / image.width(),
                     wnd_coords[tvi[0]].y() /
                         image.height() // (maybe '1 - wndcoords...'?) wndcoords of the projected/rendered
                                        // model triangle (in the input img). Normalised to 0,1.
					)};
            detail::Vertex<double> pb{
                Vector4d(mesh.texcoords[tti[1]][0] * tex_width,
				mesh.texcoords[tti[1]][1] * tex_height,
                     wnd_coords[tvi[1]].z(), // z_ndc
                     wnd_coords[tvi[1]].w()), // 1/w_clip
                Vector3d(),                       // empty
                Vector2d(wnd_coords[tvi[1]].x() / image.width(),
                     wnd_coords[tvi[1]].y() /
                         image.height() // (maybe '1 - wndcoords...'?) wndcoords of the projected/rendered
                                        // model triangle (in the input img). Normalised to 0,1.
					)};
            detail::Vertex<double> pc{
                Vector4d(mesh.texcoords[tti[2]][0] * tex_width,
				mesh.texcoords[tti[2]][1] * tex_height,
                     wnd_coords[tvi[2]].z(), // z_ndc
				wnd_coords[tvi[2]].w()), // 1/w_clip
                Vector3d(),                       // empty
                Vector2d(wnd_coords[tvi[2]].x() / image.width(),
                     wnd_coords[tvi[2]].y() /
                         image.height() // (maybe '1 - wndcoords...'?) wndcoords of the projected/rendered
                                        // model triangle (in the input img). Normalised to 0,1.
					)};
            // The wnd_coords (now p[a|b|c].texcoords) can actually be outside the image, if the head is
            // outside the image. Just skip the whole triangle if that is the case:
            if (pa.texcoords.x() < 0 || pa.texcoords.x() > 1 || pa.texcoords.y() < 0 || pa.texcoords.y() > 1 ||
                pb.texcoords.x() < 0 || pb.texcoords.x() > 1 || pb.texcoords.y() < 0 || pb.texcoords.y() > 1 ||
                pc.texcoords.x() < 0 || pc.texcoords.x() > 1 || pc.texcoords.y() < 0 || pc.texcoords.y() > 1)
            {
                continue;
            }
            extraction_rasterizer.raster_triangle(pa, pb, pc, image_to_extract_from_as_tex);
        }
    }

    return extraction_rasterizer.colorbuffer;
}